

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O1

bool google::protobuf::compiler::java::anon_unknown_7::EqualWithSuffix
               (string_view name1,string_view suffix,string_view name2)

{
  int iVar1;
  ulong __n;
  size_t __n_00;
  ulong uVar2;
  size_type __rlen;
  size_type __rlen_2;
  bool bVar3;
  bool bVar4;
  
  __n_00 = name1._M_len;
  uVar2 = name2._M_len;
  __n = suffix._M_len;
  if (__n == 0) {
    bVar3 = true;
  }
  else if (uVar2 < __n) {
    bVar3 = false;
  }
  else {
    iVar1 = bcmp(name2._M_str + (uVar2 - __n),suffix._M_str,__n);
    bVar3 = iVar1 == 0;
  }
  bVar4 = false;
  if ((bVar3) && (uVar2 - __n == __n_00)) {
    if (__n_00 == 0) {
      bVar4 = true;
    }
    else {
      iVar1 = bcmp(name1._M_str,name2._M_str,__n_00);
      bVar4 = iVar1 == 0;
    }
  }
  return bVar4;
}

Assistant:

bool EqualWithSuffix(absl::string_view name1, absl::string_view suffix,
                     absl::string_view name2) {
  if (!absl::ConsumeSuffix(&name2, suffix)) return false;
  return name1 == name2;
}